

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monk.cpp
# Opt level: O1

void __thiscall Monk::Monk(Monk *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Position> *__args_1;
  undefined1 local_2d;
  int local_2c;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  int local_18 [2];
  
  Hero::Hero(&this->super_Hero,0x14,0,-0x14,0,0x28,300);
  (this->super_Hero)._vptr_Hero = (_func_int **)&PTR__Hero_00115cf8;
  local_2c = Hero::getDamage(&this->super_Hero);
  __args_1 = Hero::getPosition(&this->super_Hero);
  local_18[1] = 0;
  local_18[0] = 1;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HealStrike,std::allocator<HealStrike>,int,std::shared_ptr<Position>const&,Strike::StrikeType,int>
            (&_Stack_20,(HealStrike **)&local_28,(allocator<HealStrike> *)&local_2d,&local_2c,
             __args_1,(StrikeType *)(local_18 + 1),local_18);
  _Var2._M_pi = _Stack_20._M_pi;
  peVar1 = local_28;
  local_28 = (element_type *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->super_Hero).m_Strike.super___shared_ptr<Strike,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->super_Hero).m_Strike.super___shared_ptr<Strike,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  (this->super_Hero).m_Strike.super___shared_ptr<Strike,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  (this->super_Hero).m_Class = MONK;
  return;
}

Assistant:

Monk::Monk() : Hero(20, 0, -20, 0, 40, 300)
{
    m_Strike = std::make_shared<HealStrike>(
            getDamage(), getPosition(), Strike::StrikeType::ALIAS, 1);
    m_Class = Hero::Class::MONK;
}